

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall discordpp::SelectOption::SelectOption(SelectOption *this,SelectOption *param_1)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer *__ptr_1;
  
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->label,&param_1->label);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->value,&param_1->value);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->description).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->description).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->description)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<discordpp::Emoji>::field
            (&(this->emoji).super_field<discordpp::Emoji>,
             &(param_1->emoji).super_field<discordpp::Emoji>);
  (this->emoji)._vptr_omittable_field = (_func_int **)&PTR_operator__0024fc08;
  _Var1._M_head_impl =
       (param_1->default_selected).super_field<bool>.t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (bool *)0x0) {
    (this->default_selected).super_field<bool>.t_._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (bool *)0x0;
    _Var2._M_head_impl = (bool *)0x0;
  }
  else {
    _Var2._M_head_impl = (bool *)operator_new(1);
    *_Var2._M_head_impl = *_Var1._M_head_impl;
  }
  (this->default_selected).super_field<bool>.t_._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  (this->default_selected).super_field<bool>.s_ = (param_1->default_selected).super_field<bool>.s_;
  (this->default_selected)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e158;
  return;
}

Assistant:

SelectOption(
        field<std::string> label = uninitialized,
        field<std::string> value = uninitialized,
        omittable_field<std::string> description = omitted,
        omittable_field<Emoji> emoji = omitted,
        omittable_field<bool> default_selected = omitted
    ):
        label(label),
        value(value),
        description(description),
        emoji(emoji),
        default_selected(default_selected)
    {}